

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O0

void __thiscall KDReports::Test::testVerticalHeader(Test *this)

{
  int iVar1;
  QFont *pQVar2;
  AutoTableElement *pAVar3;
  AutoTableElement local_c8 [8];
  AutoTableElement tableElement;
  QLatin1String local_a8;
  QString local_98;
  QFont local_80 [16];
  QLatin1String local_70;
  QString local_60;
  QFont local_48 [32];
  Report local_28 [8];
  Report report;
  Test *this_local;
  
  fillModel(this,4,0x14,false);
  KDReports::Report::Report(local_28,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)local_28);
  QLatin1String::QLatin1String(&local_70,"Noto Sans");
  QString::QString(&local_60,local_70);
  QFont::QFont(local_48,&local_60,8,-1,false);
  KDReports::Report::setDefaultFont((QFont *)local_28);
  QFont::~QFont(local_48);
  QString::~QString(&local_60);
  pQVar2 = (QFont *)KDReports::Report::mainTable();
  QLatin1String::QLatin1String(&local_a8,"courier");
  QString::QString(&local_98,local_a8);
  QFont::QFont(local_80,&local_98,0x1e,-1,false);
  KDReports::MainTable::setVerticalHeaderFont(pQVar2);
  QFont::~QFont(local_80);
  QString::~QString(&local_98);
  KDReports::AutoTableElement::AutoTableElement(local_c8,(QAbstractItemModel *)&this->m_model);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(local_c8,0));
  KDReports::AbstractTableElement::setPadding(3.0);
  pAVar3 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::MainTable::setAutoTableElement(pAVar3);
  iVar1 = KDReports::Report::numberOfPages();
  QTest::qCompare(iVar1,2,"report.numberOfPages()","2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                  ,0x1b1);
  KDReports::AutoTableElement::~AutoTableElement(local_c8);
  KDReports::Report::~Report(local_28);
  return;
}

Assistant:

void testVerticalHeader()
    {
        // Check that the font for vertical headers is taken into account
        // in the layouting.
        // For that, we make it huge, and we check that the report takes two pages.
        fillModel(4, 20);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 8));
        report.mainTable()->setVerticalHeaderFont(QFont(QLatin1String("courier"), 30));
        AutoTableElement tableElement(&m_model);
        tableElement.setVerticalHeaderVisible(true);
        tableElement.setPadding(3);
        report.mainTable()->setAutoTableElement(tableElement);
        QCOMPARE(report.numberOfPages(), 2);
    }